

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest1_2::deinit(FunctionalTest1_2 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  FunctionalTest1_2 *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  deinitTestIteration(this);
  if (this->m_xfb_bo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_xfb_bo_id);
    this->m_xfb_bo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  return;
}

Assistant:

void FunctionalTest1_2::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	deinitTestIteration();

	if (m_xfb_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_xfb_bo_id);

		m_xfb_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}